

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

bool __thiscall cppcms::form::iterator::equal(iterator *this,iterator *other)

{
  long in_RSI;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *in_RDI;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_ffffffffffffffd8;
  bool local_11;
  
  local_11 = false;
  if ((in_RDI[1].c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Deque_impl_data._M_map == *(_Map_pointer *)(in_RSI + 0x50)) &&
     (local_11 = false,
     (int)in_RDI[1].c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Deque_impl_data._M_map_size == *(int *)(in_RSI + 0x58))) {
    local_11 = std::operator==(in_RDI,in_stack_ffffffffffffffd8);
  }
  return local_11;
}

Assistant:

bool form::iterator::equal(form::iterator const &other) const
{
	return 	current_ == other.current_ 
		&& offset_ == other.offset_
		&& return_positions_ == other.return_positions_;
}